

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O1

ncnn_datareader_t ncnn_datareader_create_from_stdio(FILE *fp)

{
  ncnn_datareader_t p_Var1;
  DataReaderFromStdio *this;
  
  p_Var1 = (ncnn_datareader_t)malloc(0x18);
  this = (DataReaderFromStdio *)operator_new(0x18);
  ncnn::DataReaderFromStdio::DataReaderFromStdio(this,fp);
  (this->super_DataReader)._vptr_DataReader = (_func_int **)&PTR__DataReaderFromStdio_005b8990;
  this[1].super_DataReader._vptr_DataReader = (_func_int **)p_Var1;
  p_Var1->pthis = this;
  p_Var1->scan = __ncnn_DataReaderFromStdio_scan;
  p_Var1->read = __ncnn_DataReaderFromStdio_read;
  return p_Var1;
}

Assistant:

ncnn_datareader_t ncnn_datareader_create_from_stdio(FILE* fp)
{
    ncnn_datareader_t dr = (ncnn_datareader_t)malloc(sizeof(struct __ncnn_datareader_t));
    dr->pthis = (void*)(new DataReaderFromStdio_c_api(fp, dr));
#if NCNN_STRING
    dr->scan = __ncnn_DataReaderFromStdio_scan;
#endif /* NCNN_STRING */
    dr->read = __ncnn_DataReaderFromStdio_read;
    return dr;
}